

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  string *localPath;
  cmGeneratedFileStream *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  pointer pbVar3;
  bool bVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  string *psVar7;
  _Alloc_hider this_00;
  undefined8 in_R8;
  string *d;
  pointer pbVar8;
  string_view str;
  string_view str_00;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  string_view source_04;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string depTarget;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string dir;
  ostringstream depCmd;
  
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&dir,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  _depCmd = (pointer)dir._M_string_length;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000011;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_f37e56;
  cmStrCat<>(&depTarget,(cmAlphaNum *)&depCmd,(cmAlphaNum *)&dirs);
  localPath = &this->InfoFileNameFull;
  std::__cxx11::string::operator=((string *)localPath,(string *)&depTarget);
  std::__cxx11::string::~string((string *)&depTarget);
  cmLocalUnixMakefileGenerator3::ConvertToFullPath((string *)&depCmd,this->LocalGenerator,localPath)
  ;
  std::__cxx11::string::operator=((string *)localPath,(string *)&depCmd);
  std::__cxx11::string::~string((string *)&depCmd);
  std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&depCmd);
  this_00._M_p = _depCmd;
  _depCmd = (pointer)0x0;
  pcVar1 = (this->InfoFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->InfoFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
       (cmGeneratedFileStream *)this_00._M_p;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))(pcVar1);
    if ((long *)_depCmd != (long *)0x0) {
      (**(code **)(*(long *)_depCmd + 8))();
    }
    this_00._M_p = (pointer)(this->InfoFileStream)._M_t.
                            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  }
  if ((cmGeneratedFileStream *)this_00._M_p != (cmGeneratedFileStream *)0x0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)this_00._M_p,true);
    cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
              (this->LocalGenerator,
               (ostream *)
               (this->InfoFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar5 = std::operator<<((ostream *)
                               (this->InfoFileStream)._M_t.
                               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                               "\n");
      poVar5 = std::operator<<(poVar5,"# Pairs of files generated by the same build rule.\n");
      std::operator<<(poVar5,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n");
      for (p_Var6 = (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; pcVar1 = (this->InfoFileStream)._M_t.
                     super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                     .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
          (_Rb_tree_header *)p_Var6 !=
          &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        poVar5 = std::operator<<((ostream *)pcVar1,"  ");
        str._M_str = (char *)0x0;
        str._M_len = *(ulong *)(p_Var6 + 1);
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  ((string *)&depCmd,(cmOutputConverter *)p_Var6[1]._M_parent,str,(WrapQuotes)in_R8)
        ;
        poVar5 = std::operator<<(poVar5,(string *)&depCmd);
        poVar5 = std::operator<<(poVar5," ");
        str_00._M_str = (char *)0x0;
        str_00._M_len = *(ulong *)(p_Var6 + 2);
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  ((string *)&dirs,(cmOutputConverter *)p_Var6[2]._M_parent,str_00,(WrapQuotes)in_R8
                  );
        poVar5 = std::operator<<(poVar5,(string *)&dirs);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&dirs);
        std::__cxx11::string::~string((string *)&depCmd);
      }
      std::operator<<((ostream *)pcVar1,"  )\n\n");
    }
    poVar5 = std::operator<<((ostream *)
                             (this->InfoFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "\n");
    poVar5 = std::operator<<(poVar5,"# Targets to which this target links.\n");
    std::operator<<(poVar5,"set(CMAKE_TARGET_LINKED_INFO_FILES\n");
    GetConfigName_abi_cxx11_((string *)&depCmd,this);
    cmCommonTargetGenerator::GetLinkedTargetDirectories
              (&dirs,&this->super_cmCommonTargetGenerator,(string *)&depCmd);
    std::__cxx11::string::~string((string *)&depCmd);
    pbVar3 = dirs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar8 = dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (this->InfoFileStream)._M_t.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
        pbVar8 != pbVar3; pbVar8 = pbVar8 + 1) {
      poVar5 = std::operator<<((ostream *)pcVar1,"  \"");
      poVar5 = std::operator<<(poVar5,(string *)pbVar8);
      std::operator<<(poVar5,"/DependInfo.cmake\"\n");
    }
    std::operator<<((ostream *)pcVar1,"  )\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dirs);
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)this->LocalGenerator);
    poVar5 = std::operator<<((ostream *)
                             (this->InfoFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "\n");
    poVar5 = std::operator<<(poVar5,"# Fortran module output directory.\n");
    poVar5 = std::operator<<(poVar5,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"");
    cmGeneratorTarget::GetFortranModuleDirectory
              ((string *)&depCmd,(this->super_cmCommonTargetGenerator).GeneratorTarget,psVar7);
    poVar5 = std::operator<<(poVar5,(string *)&depCmd);
    std::operator<<(poVar5,"\")\n");
    std::__cxx11::string::~string((string *)&depCmd);
    bVar4 = cmGeneratorTarget::IsFortranBuildingInstrinsicModules
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if (bVar4) {
      poVar5 = std::operator<<((ostream *)
                               (this->InfoFileStream)._M_t.
                               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                               "\n");
      poVar5 = std::operator<<(poVar5,"# Fortran compiler is building intrinsic modules.\n");
      std::operator<<(poVar5,"set(CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES ON) \n");
    }
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
              (&local_2e8,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    _depCmd = (pointer)local_2e8._M_string_length;
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7;
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_f38030;
    cmStrCat<>(&depTarget,(cmAlphaNum *)&depCmd,(cmAlphaNum *)&dirs);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&depCmd);
    poVar5 = std::operator<<((ostream *)&depCmd,"cd ");
    pcVar2 = this->LocalGenerator;
    psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source._M_str = (psVar7->_M_dataplus)._M_p;
    source._M_len = psVar7->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&dirs,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&dirs);
    std::operator<<(poVar5," && ");
    std::__cxx11::string::~string((string *)&dirs);
    poVar5 = std::operator<<((ostream *)&depCmd,"$(CMAKE_COMMAND) -E cmake_depends \"");
    (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
      _vptr_cmGlobalGenerator[3])(&dirs);
    poVar5 = std::operator<<(poVar5,(string *)&dirs);
    poVar5 = std::operator<<(poVar5,"\" ");
    pcVar2 = this->LocalGenerator;
    psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source_00._M_str = (psVar7->_M_dataplus)._M_p;
    source_00._M_len = psVar7->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_2e8,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_00,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_2e8);
    poVar5 = std::operator<<(poVar5," ");
    pcVar2 = this->LocalGenerator;
    psVar7 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source_01._M_str = (psVar7->_M_dataplus)._M_p;
    source_01._M_len = psVar7->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_1e8,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_01,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_1e8);
    poVar5 = std::operator<<(poVar5," ");
    pcVar2 = this->LocalGenerator;
    psVar7 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source_02._M_str = (psVar7->_M_dataplus)._M_p;
    source_02._M_len = psVar7->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_208,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_02,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_208);
    poVar5 = std::operator<<(poVar5," ");
    pcVar2 = this->LocalGenerator;
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar2);
    source_03._M_str = (psVar7->_M_dataplus)._M_p;
    source_03._M_len = psVar7->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_228,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_03,SHELL);
    poVar5 = std::operator<<(poVar5,(string *)&local_228);
    poVar5 = std::operator<<(poVar5," ");
    pcVar2 = this->LocalGenerator;
    cmsys::SystemTools::CollapseFullPath(&local_268,localPath);
    source_04._M_str = local_268._M_dataplus._M_p;
    source_04._M_len = local_268._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_248,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_04,SHELL);
    std::operator<<(poVar5,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&dirs);
    if (this->LocalGenerator->ColorMakefile == true) {
      std::operator<<((ostream *)&depCmd," --color=$(COLOR)");
    }
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs);
    std::__cxx11::string::~string((string *)&dirs);
    if (this->CustomCommandDriver == OnDepends) {
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&depends,&this->CustomCommandOutputs);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->LocalGenerator,
               (ostream *)
               (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,(char *)0x0,
               &depTarget,&depends,&commands,true,false);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depCmd);
    std::__cxx11::string::~string((string *)&depTarget);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
  }
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = cmStrCat(dir, "/DependInfo.cmake");
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream =
    cm::make_unique<cmGeneratedFileStream>(this->InfoFileNameFull);
  if (!this->InfoFileStream) {
    return;
  }
  this->InfoFileStream->SetCopyIfDifferent(true);
  this->LocalGenerator->WriteDependLanguageInfo(*this->InfoFileStream,
                                                this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if (!this->MultipleOutputPairs.empty()) {
    /* clang-format off */
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    /* clang-format on */
    for (auto const& pi : this->MultipleOutputPairs) {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi.first) << " "
        << cmOutputConverter::EscapeForCMake(pi.second) << "\n";
    }
    *this->InfoFileStream << "  )\n\n";
  }

  // Store list of targets linked directly or transitively.
  {
    /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Targets to which this target links.\n"
    << "set(CMAKE_TARGET_LINKED_INFO_FILES\n";
    /* clang-format on */
    std::vector<std::string> dirs =
      this->GetLinkedTargetDirectories(this->GetConfigName());
    for (std::string const& d : dirs) {
      *this->InfoFileStream << "  \"" << d << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";
  }

  std::string const& working_dir =
    this->LocalGenerator->GetCurrentBinaryDirectory();

  /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GeneratorTarget->GetFortranModuleDirectory(working_dir)
    << "\")\n";

  if (this->GeneratorTarget->IsFortranBuildingInstrinsicModules()) {
    *this->InfoFileStream
      << "\n"
      << "# Fortran compiler is building intrinsic modules.\n"
      << "set(CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES ON) \n";
  }
  /* clang-format on */

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string depTarget = cmStrCat(
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget),
    "/depend");

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
// TODO: Account for source file properties and directory-level
// definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd "
         << (this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetBinaryDirectory(),
              cmOutputConverter::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetSourceDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetCurrentSourceDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetBinaryDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetCurrentBinaryDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(this->InfoFileNameFull),
              cmOutputConverter::SHELL);
  if (this->LocalGenerator->GetColorMakefile()) {
    depCmd << " --color=$(COLOR)";
  }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if (this->CustomCommandDriver == OnDepends) {
    this->DriveCustomCommands(depends);
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      depTarget, depends, commands, true);
}